

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

bool __thiscall Json::Reader::decodeDouble(Reader *this,Token *token,Value *decoded)

{
  uint uVar1;
  istream *piVar2;
  double value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string buffer;
  ValueHolder local_1d0;
  undefined2 local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  istringstream is;
  
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&buffer,token->start_,token->end_);
  std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)&buffer,_S_in);
  piVar2 = std::istream::_M_extract<double>((double *)&is);
  uVar1 = *(uint *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18) + 0x20);
  if ((uVar1 & 5) == 0) {
    local_1c8 = 3;
    local_1c0 = 0;
    uStack_1b8 = 0;
    local_1b0 = 0;
    local_1d0.int_ = 0;
    Value::swap(decoded,(Value *)&local_1d0);
    Value::~Value((Value *)&local_1d0);
  }
  else {
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,token->start_,token->end_);
    std::operator+(&local_230,"\'",&local_250);
    std::operator+(&local_210,&local_230,"\' is not a number.");
    addError(this,&local_210,token,(Location)0x0);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_250);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  std::__cxx11::string::~string((string *)&buffer);
  return (uVar1 & 5) == 0;
}

Assistant:

bool Reader::decodeDouble(Token& token, Value& decoded) {
  double value = 0;
  JSONCPP_STRING buffer(token.start_, token.end_);
  JSONCPP_ISTRINGSTREAM is(buffer);
  if (!(is >> value))
    return addError("'" + JSONCPP_STRING(token.start_, token.end_) +
                        "' is not a number.",
                    token);
  decoded = value;
  return true;
}